

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# section.cpp
# Opt level: O0

void sect_String(char *s)

{
  bool bVar1;
  size_t sVar2;
  uint8_t *local_10;
  char *s_local;
  
  bVar1 = checkcodesection();
  if (bVar1) {
    sVar2 = strlen(s);
    bVar1 = reserveSpace((uint32_t)sVar2);
    local_10 = (uint8_t *)s;
    if (bVar1) {
      while (*local_10 != '\0') {
        writebyte(*local_10);
        local_10 = local_10 + 1;
      }
    }
  }
  return;
}

Assistant:

void sect_String(char const *s)
{
	if (!checkcodesection())
		return;
	if (!reserveSpace(strlen(s)))
		return;

	while (*s)
		writebyte(*s++);
}